

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtouchhandler.cpp
# Opt level: O0

void __thiscall
QEvdevTouchScreenData::QEvdevTouchScreenData
          (QEvdevTouchScreenData *this,QEvdevTouchScreenHandler *q_ptr,QStringList *args)

{
  char16_t *pcVar1;
  QStringView s;
  bool bVar2;
  int iVar3;
  QStringView *this_00;
  QStringView *in_RDX;
  Data *in_RSI;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  QString *arg;
  QStringList *__range1;
  size_t RuntimeThreshold;
  size_t i;
  QStringView prefix;
  const_iterator __end1;
  const_iterator __begin1;
  QString *in_stack_ffffffffffffff18;
  QTransform *in_stack_ffffffffffffff20;
  QStringView *n;
  ulong local_88;
  QString local_40;
  char16_t *local_28;
  QString *local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&in_RDI->m_size)->d = in_RSI;
  *(undefined4 *)&in_RDI->m_data = 0xffffffff;
  QList<QWindowSystemInterface::TouchPoint>::QList
            ((QList<QWindowSystemInterface::TouchPoint> *)0x1107bd);
  QList<QWindowSystemInterface::TouchPoint>::QList
            ((QList<QWindowSystemInterface::TouchPoint> *)0x1107cb);
  QHash<int,_QEvdevTouchScreenData::Contact>::QHash
            ((QHash<int,_QEvdevTouchScreenData::Contact> *)(in_RDI + 4));
  QHash<int,_QEvdevTouchScreenData::Contact>::QHash
            ((QHash<int,_QEvdevTouchScreenData::Contact> *)&in_RDI[4].m_data);
  Contact::Contact((Contact *)(in_RDI + 5));
  *(undefined4 *)&in_RDI[6].m_data = 0;
  in_RDI[7].m_size = 0;
  in_RDI[7].m_data = (storage_type_conflict *)0x0;
  *(undefined4 *)&in_RDI[8].m_size = 0;
  pcVar1 = (char16_t *)((long)&in_RDI[8].m_size + 4);
  pcVar1[0] = L'\0';
  pcVar1[1] = L'\0';
  *(undefined4 *)&in_RDI[8].m_data = 0;
  *(undefined4 *)((long)&in_RDI[8].m_data + 4) = 0;
  *(undefined4 *)&((DataPointer *)&in_RDI[9].m_size)->d = 0;
  pcVar1 = (char16_t *)((long)&((DataPointer *)&in_RDI[9].m_size)->d + 4);
  pcVar1[0] = L'\0';
  pcVar1[1] = L'\0';
  QString::QString((QString *)0x110859);
  QString::QString((QString *)0x11086a);
  *(undefined1 *)&in_RDI[0xc].m_data = 0;
  *(undefined1 *)((long)&in_RDI[0xc].m_data + 1) = 0;
  QTransform::QTransform(in_stack_ffffffffffffff20);
  *(undefined1 *)&((DataPointer *)&in_RDI[0x12].m_size)->d = 0;
  QString::QString((QString *)0x1108a1);
  QPointer<QScreen>::QPointer((QPointer<QScreen> *)0x1108b2);
  *(undefined1 *)&((DataPointer *)&in_RDI[0x15].m_size)->d = 0;
  pcVar1 = (char16_t *)((long)&((DataPointer *)&in_RDI[0x15].m_size)->d + 4);
  pcVar1[0] = L'\0';
  pcVar1[1] = L'\0';
  QMutex::QMutex((QMutex *)0x1108d4);
  local_10.i = (QString *)0xaaaaaaaaaaaaaaaa;
  n = in_RDX;
  local_10 = QList<QString>::begin((QList<QString> *)in_stack_ffffffffffffff20);
  local_18.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_18 = QList<QString>::end((QList<QString> *)in_stack_ffffffffffffff20);
  while( true ) {
    local_20 = local_18.i;
    bVar2 = QList<QString>::const_iterator::operator!=(&local_10,local_18);
    if (!bVar2) break;
    this_00 = (QStringView *)QList<QString>::const_iterator::operator*(&local_10);
    local_28 = L"force_window";
    bVar2 = operator==((QString *)in_stack_ffffffffffffff20,(char16_t **)in_stack_ffffffffffffff18);
    if (bVar2) {
      *(undefined1 *)&in_RDI[0xc].m_data = 1;
    }
    else {
      local_40.d.size = 0x12ed5e;
      bVar2 = operator==((QString *)in_stack_ffffffffffffff20,(char16_t **)in_stack_ffffffffffffff18
                        );
      if (bVar2) {
        *(undefined1 *)&((DataPointer *)&in_RDI[0x15].m_size)->d = 1;
      }
      else {
        local_40.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_40.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        in_stack_ffffffffffffff18 = &local_40;
        in_stack_ffffffffffffff20 =
             (QTransform *)std::data<char16_t_const,12ul>((char16_t (*) [12])L"prediction=");
        for (local_88 = 0; (local_88 < 0xc && (L"prediction="[local_88] != L'\0'));
            local_88 = local_88 + 1) {
        }
        QStringView::QStringView<char16_t,_true>
                  (this_00,(char16_t *)in_RDI,(qsizetype)in_stack_ffffffffffffff20);
        s.m_data = (storage_type_conflict *)in_RSI;
        s.m_size = (qsizetype)n;
        bVar2 = QString::startsWith(in_stack_ffffffffffffff18,s,CaseInsensitive);
        if (bVar2) {
          QStringView::QStringView<QString,_true>(this_00,(QString *)in_RDI);
          QStringView::size((QStringView *)&local_40);
          QStringView::mid(in_RDX,(qsizetype)in_RSI,(qsizetype)n);
          iVar3 = QStringView::toInt(in_RDI,(bool *)in_stack_ffffffffffffff20,
                                     (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
          *(int *)((long)&((DataPointer *)&in_RDI[0x15].m_size)->d + 4) = iVar3;
        }
      }
    }
    QList<QString>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QEvdevTouchScreenData::QEvdevTouchScreenData(QEvdevTouchScreenHandler *q_ptr, const QStringList &args)
    : q(q_ptr),
      m_lastEventType(-1),
      m_currentSlot(0),
      m_timeStamp(0), m_lastTimeStamp(0),
      hw_range_x_min(0), hw_range_x_max(0),
      hw_range_y_min(0), hw_range_y_max(0),
      hw_pressure_min(0), hw_pressure_max(0),
      m_forceToActiveWindow(false), m_typeB(false), m_singleTouch(false),
      m_filtered(false), m_prediction(0)
{
    for (const QString &arg : args) {
        if (arg == u"force_window")
            m_forceToActiveWindow = true;
        else if (arg == u"filtered")
            m_filtered = true;
        else if (const QStringView prefix = u"prediction="; arg.startsWith(prefix))
            m_prediction = QStringView(arg).mid(prefix.size()).toInt();
    }
}